

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int r1f5kf_(int *ido,int *l1,double *cc,int *in1,double *ch,int *in2,double *wa1,double *wa2,
           double *wa3,double *wa4)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  int iVar25;
  long lVar26;
  double *pdVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  double *pdVar37;
  double *pdVar38;
  double *pdVar39;
  int iVar40;
  long lVar41;
  double *pdVar42;
  double *pdVar43;
  bool bVar44;
  double *local_180;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  ulong local_c8;
  double *local_b0;
  
  lVar22 = (long)*in1;
  iVar33 = *ido;
  lVar34 = (long)iVar33;
  uVar1 = *l1;
  iVar4 = ~((uVar1 + 1) * iVar33) * *in1 + -1;
  iVar2 = *in2;
  lVar35 = (long)iVar2;
  lVar8 = (long)(~(iVar33 * 6) * iVar2 + -1);
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  uVar13 = (ulong)uVar3;
  lVar28 = ((long)(int)uVar1 + 1) * lVar34;
  pdVar27 = cc + (lVar28 + 1) * lVar22 + 1;
  lVar9 = lVar34 * lVar22;
  lVar16 = ((long)(int)(uVar1 * 5) + 1) * lVar34;
  pdVar23 = cc + (lVar16 + 1) * lVar22 + 1;
  lVar41 = ((long)(int)(uVar1 * 2) + 1) * lVar34;
  pdVar14 = cc + (lVar41 + 1) * lVar22 + 1;
  lVar19 = ((long)(int)(uVar1 * 4) + 1) * lVar34;
  pdVar17 = cc + (lVar19 + 1) * lVar22 + 1;
  lVar26 = ((long)(int)(uVar1 * 3) + 1) * lVar34;
  pdVar20 = cc + (lVar26 + 1) * lVar22 + 1;
  iVar5 = iVar2 * iVar33;
  iVar25 = iVar5 * 10;
  iVar6 = iVar5 * 8;
  lVar29 = lVar34 * 10;
  lVar30 = lVar34 * lVar35;
  lVar31 = lVar34 * 6;
  pdVar36 = ch + lVar8 + 1;
  pdVar10 = pdVar36;
  while (bVar44 = uVar13 != 0, uVar13 = uVar13 - 1, bVar44) {
    pdVar10[(lVar31 + 1) * lVar35] =
         pdVar17[iVar4] + pdVar20[iVar4] + pdVar23[iVar4] + pdVar14[iVar4] + pdVar27[iVar4];
    pdVar36[iVar6] =
         (pdVar17[iVar4] + pdVar20[iVar4]) * -0.8090169943749473 +
         (pdVar23[iVar4] + pdVar14[iVar4]) * 0.30901699437494745 + pdVar27[iVar4];
    pdVar10[(lVar34 * 8 + 1) * lVar35] =
         (pdVar23[iVar4] - pdVar14[iVar4]) * 0.9510565162951535 +
         (pdVar17[iVar4] - pdVar20[iVar4]) * 0.5877852522924732;
    pdVar36[iVar25] =
         (pdVar17[iVar4] + pdVar20[iVar4]) * 0.30901699437494745 +
         (pdVar23[iVar4] + pdVar14[iVar4]) * -0.8090169943749473 + pdVar27[iVar4];
    pdVar10[(lVar29 + 1) * lVar35] =
         (pdVar23[iVar4] - pdVar14[iVar4]) * 0.5877852522924732 +
         (pdVar17[iVar4] - pdVar20[iVar4]) * -0.9510565162951535;
    pdVar27 = pdVar27 + lVar9;
    pdVar23 = pdVar23 + lVar9;
    pdVar14 = pdVar14 + lVar9;
    pdVar17 = pdVar17 + lVar9;
    pdVar20 = pdVar20 + lVar9;
    iVar25 = iVar25 + iVar5 * 5;
    iVar6 = iVar6 + iVar5 * 5;
    pdVar10 = pdVar10 + lVar30 * 5;
  }
  if (iVar33 != 1) {
    local_d0 = cc + (lVar28 + 2) * lVar22 + 1;
    local_d8 = cc + (lVar41 + 2) * lVar22 + 1;
    pdVar20 = cc + (lVar16 + 2) * lVar22 + 1;
    pdVar17 = cc + (lVar26 + 2) * lVar22 + 1;
    pdVar43 = cc + (lVar19 + 2) * lVar22 + 1;
    pdVar23 = cc + (lVar41 + 3) * lVar22 + 1;
    pdVar14 = cc + (lVar16 + 3) * lVar22 + 1;
    pdVar27 = cc + (lVar26 + 3) * lVar22 + 1;
    pdVar38 = cc + (lVar19 + 3) * lVar22 + 1;
    pdVar10 = cc + (lVar28 + 3) * lVar22 + 1;
    local_e0 = ch + (lVar31 + 2) * lVar35 + 1;
    local_e8 = ch + (lVar34 * 8 + 2) * lVar35 + 1;
    local_f0 = ch + (lVar29 + 2) * lVar35 + 1;
    pdVar32 = ch + (lVar31 + 3) * lVar35 + 1;
    local_f8 = ch + (lVar34 * 8 + 3) * lVar35 + 1;
    pdVar37 = ch + (lVar29 + 3) * lVar35 + 1;
    iVar6 = (iVar33 * 8 + -2) * iVar2;
    iVar5 = iVar2 * iVar33 * 5;
    iVar25 = (iVar33 * 10 + -2) * iVar2;
    iVar40 = (iVar33 * 8 + -1) * iVar2;
    iVar33 = (iVar33 * 10 + -1) * iVar2;
    for (local_c8 = 1; local_c8 != uVar3 + 1; local_c8 = local_c8 + 1) {
      iVar7 = 0;
      local_148 = local_f8;
      local_158 = local_f0;
      local_160 = local_e8;
      local_168 = local_e0;
      pdVar11 = local_d0;
      pdVar12 = local_d8;
      pdVar15 = pdVar14;
      pdVar18 = pdVar17;
      pdVar21 = pdVar20;
      pdVar24 = pdVar23;
      pdVar39 = pdVar38;
      pdVar42 = pdVar27;
      local_180 = pdVar10;
      local_150 = pdVar32;
      local_140 = pdVar37;
      local_b0 = pdVar43;
      for (lVar16 = 3; lVar16 <= lVar34; lVar16 = lVar16 + 2) {
        local_168[lVar8] =
             wa3[lVar16 + -3] * local_b0[iVar4] + wa3[lVar16 + -2] * pdVar39[iVar4] +
             wa2[lVar16 + -3] * pdVar18[iVar4] + wa2[lVar16 + -2] * pdVar42[iVar4] +
             wa4[lVar16 + -3] * pdVar21[iVar4] + wa4[lVar16 + -2] * pdVar15[iVar4] +
             wa1[lVar16 + -3] * pdVar12[iVar4] + wa1[lVar16 + -2] * pdVar24[iVar4] + pdVar11[iVar4];
        local_150[lVar8] =
             (wa3[lVar16 + -3] * pdVar39[iVar4] - local_b0[iVar4] * wa3[lVar16 + -2]) +
             (wa2[lVar16 + -3] * pdVar42[iVar4] - pdVar18[iVar4] * wa2[lVar16 + -2]) +
             (wa4[lVar16 + -3] * pdVar15[iVar4] - pdVar21[iVar4] * wa4[lVar16 + -2]) +
             (wa1[lVar16 + -3] * pdVar24[iVar4] - pdVar12[iVar4] * wa1[lVar16 + -2]) +
             local_180[iVar4];
        local_160[lVar8] =
             ((wa2[lVar16 + -3] * pdVar42[iVar4] - pdVar18[iVar4] * wa2[lVar16 + -2]) -
             (wa3[lVar16 + -3] * pdVar39[iVar4] - local_b0[iVar4] * wa3[lVar16 + -2])) *
             0.5877852522924732 +
             ((wa1[lVar16 + -3] * pdVar24[iVar4] - pdVar12[iVar4] * wa1[lVar16 + -2]) -
             (wa4[lVar16 + -3] * pdVar15[iVar4] - pdVar21[iVar4] * wa4[lVar16 + -2])) *
             0.9510565162951535 +
             (wa3[lVar16 + -2] * pdVar39[iVar4] +
             wa3[lVar16 + -3] * local_b0[iVar4] +
             wa2[lVar16 + -3] * pdVar18[iVar4] + wa2[lVar16 + -2] * pdVar42[iVar4]) *
             -0.8090169943749473 +
             (wa4[lVar16 + -2] * pdVar15[iVar4] +
             wa4[lVar16 + -3] * pdVar21[iVar4] +
             wa1[lVar16 + -3] * pdVar12[iVar4] + wa1[lVar16 + -2] * pdVar24[iVar4]) *
             0.30901699437494745 + pdVar11[iVar4];
        pdVar36[iVar6 + iVar7] =
             ((wa3[lVar16 + -2] * pdVar39[iVar4] +
              wa3[lVar16 + -3] * local_b0[iVar4] +
              wa2[lVar16 + -3] * pdVar18[iVar4] + wa2[lVar16 + -2] * pdVar42[iVar4]) *
              -0.8090169943749473 +
             (wa4[lVar16 + -2] * pdVar15[iVar4] +
             wa4[lVar16 + -3] * pdVar21[iVar4] +
             wa1[lVar16 + -3] * pdVar12[iVar4] + wa1[lVar16 + -2] * pdVar24[iVar4]) *
             0.30901699437494745 + pdVar11[iVar4]) -
             (((wa1[lVar16 + -3] * pdVar24[iVar4] - pdVar12[iVar4] * wa1[lVar16 + -2]) -
              (wa4[lVar16 + -3] * pdVar15[iVar4] - pdVar21[iVar4] * wa4[lVar16 + -2])) *
              0.9510565162951535 +
             ((wa2[lVar16 + -3] * pdVar42[iVar4] - pdVar18[iVar4] * wa2[lVar16 + -2]) -
             (wa3[lVar16 + -3] * pdVar39[iVar4] - local_b0[iVar4] * wa3[lVar16 + -2])) *
             0.5877852522924732);
        local_148[lVar8] =
             ((wa4[lVar16 + -3] * pdVar21[iVar4] + pdVar15[iVar4] * wa4[lVar16 + -2]) -
             (pdVar12[iVar4] * wa1[lVar16 + -3] + pdVar24[iVar4] * wa1[lVar16 + -2])) *
             0.9510565162951535 +
             ((wa3[lVar16 + -3] * local_b0[iVar4] + pdVar39[iVar4] * wa3[lVar16 + -2]) -
             (wa2[lVar16 + -3] * pdVar18[iVar4] + pdVar42[iVar4] * wa2[lVar16 + -2])) *
             0.5877852522924732 +
             ((wa3[lVar16 + -3] * pdVar39[iVar4] - local_b0[iVar4] * wa3[lVar16 + -2]) +
             (wa2[lVar16 + -3] * pdVar42[iVar4] - pdVar18[iVar4] * wa2[lVar16 + -2])) *
             -0.8090169943749473 +
             ((wa4[lVar16 + -3] * pdVar15[iVar4] - pdVar21[iVar4] * wa4[lVar16 + -2]) +
             (wa1[lVar16 + -3] * pdVar24[iVar4] - pdVar12[iVar4] * wa1[lVar16 + -2])) *
             0.30901699437494745 + local_180[iVar4];
        pdVar36[iVar40 + iVar7] =
             (((wa4[lVar16 + -3] * pdVar21[iVar4] + wa4[lVar16 + -2] * pdVar15[iVar4]) -
              (wa1[lVar16 + -3] * pdVar12[iVar4] + wa1[lVar16 + -2] * pdVar24[iVar4])) *
              0.9510565162951535 +
             ((wa3[lVar16 + -3] * local_b0[iVar4] + wa3[lVar16 + -2] * pdVar39[iVar4]) -
             (wa2[lVar16 + -3] * pdVar18[iVar4] + wa2[lVar16 + -2] * pdVar42[iVar4])) *
             0.5877852522924732) -
             (((wa3[lVar16 + -3] * pdVar39[iVar4] - local_b0[iVar4] * wa3[lVar16 + -2]) +
              (wa2[lVar16 + -3] * pdVar42[iVar4] - pdVar18[iVar4] * wa2[lVar16 + -2])) *
              -0.8090169943749473 +
             ((wa4[lVar16 + -3] * pdVar15[iVar4] - pdVar21[iVar4] * wa4[lVar16 + -2]) +
             (wa1[lVar16 + -3] * pdVar24[iVar4] - pdVar12[iVar4] * wa1[lVar16 + -2])) *
             0.30901699437494745 + local_180[iVar4]);
        local_158[lVar8] =
             ((wa1[lVar16 + -3] * pdVar24[iVar4] - wa1[lVar16 + -2] * pdVar12[iVar4]) -
             (wa4[lVar16 + -3] * pdVar15[iVar4] - pdVar21[iVar4] * wa4[lVar16 + -2])) *
             0.5877852522924732 +
             ((wa2[lVar16 + -3] * pdVar42[iVar4] - pdVar18[iVar4] * wa2[lVar16 + -2]) -
             (wa3[lVar16 + -3] * pdVar39[iVar4] - local_b0[iVar4] * wa3[lVar16 + -2])) *
             -0.9510565162951535 +
             (wa3[lVar16 + -3] * local_b0[iVar4] + wa3[lVar16 + -2] * pdVar39[iVar4] +
             wa2[lVar16 + -3] * pdVar18[iVar4] + wa2[lVar16 + -2] * pdVar42[iVar4]) *
             0.30901699437494745 +
             (wa4[lVar16 + -3] * pdVar21[iVar4] + wa4[lVar16 + -2] * pdVar15[iVar4] +
             wa1[lVar16 + -3] * pdVar12[iVar4] + wa1[lVar16 + -2] * pdVar24[iVar4]) *
             -0.8090169943749473 + pdVar11[iVar4];
        pdVar36[iVar25 + iVar7] =
             ((wa3[lVar16 + -3] * local_b0[iVar4] + wa3[lVar16 + -2] * pdVar39[iVar4] +
              wa2[lVar16 + -3] * pdVar18[iVar4] + wa2[lVar16 + -2] * pdVar42[iVar4]) *
              0.30901699437494745 +
             (wa4[lVar16 + -3] * pdVar21[iVar4] + wa4[lVar16 + -2] * pdVar15[iVar4] +
             wa1[lVar16 + -3] * pdVar12[iVar4] + wa1[lVar16 + -2] * pdVar24[iVar4]) *
             -0.8090169943749473 + pdVar11[iVar4]) -
             (((wa1[lVar16 + -3] * pdVar24[iVar4] - pdVar12[iVar4] * wa1[lVar16 + -2]) -
              (wa4[lVar16 + -3] * pdVar15[iVar4] - pdVar21[iVar4] * wa4[lVar16 + -2])) *
              0.5877852522924732 +
             ((wa2[lVar16 + -3] * pdVar42[iVar4] - pdVar18[iVar4] * wa2[lVar16 + -2]) -
             (wa3[lVar16 + -3] * pdVar39[iVar4] - local_b0[iVar4] * wa3[lVar16 + -2])) *
             -0.9510565162951535);
        local_140[lVar8] =
             ((wa4[lVar16 + -3] * pdVar21[iVar4] + pdVar15[iVar4] * wa4[lVar16 + -2]) -
             (pdVar12[iVar4] * wa1[lVar16 + -3] + pdVar24[iVar4] * wa1[lVar16 + -2])) *
             0.5877852522924732 +
             ((wa3[lVar16 + -3] * local_b0[iVar4] + pdVar39[iVar4] * wa3[lVar16 + -2]) -
             (wa2[lVar16 + -3] * pdVar18[iVar4] + pdVar42[iVar4] * wa2[lVar16 + -2])) *
             -0.9510565162951535 +
             ((wa3[lVar16 + -3] * pdVar39[iVar4] - local_b0[iVar4] * wa3[lVar16 + -2]) +
             (wa2[lVar16 + -3] * pdVar42[iVar4] - pdVar18[iVar4] * wa2[lVar16 + -2])) *
             0.30901699437494745 +
             ((wa4[lVar16 + -3] * pdVar15[iVar4] - pdVar21[iVar4] * wa4[lVar16 + -2]) +
             (wa1[lVar16 + -3] * pdVar24[iVar4] - pdVar12[iVar4] * wa1[lVar16 + -2])) *
             -0.8090169943749473 + local_180[iVar4];
        pdVar36[iVar33 + iVar7] =
             (((wa4[lVar16 + -3] * pdVar21[iVar4] + wa4[lVar16 + -2] * pdVar15[iVar4]) -
              (wa1[lVar16 + -3] * pdVar12[iVar4] + wa1[lVar16 + -2] * pdVar24[iVar4])) *
              0.5877852522924732 +
             ((wa3[lVar16 + -3] * local_b0[iVar4] + wa3[lVar16 + -2] * pdVar39[iVar4]) -
             (wa2[lVar16 + -3] * pdVar18[iVar4] + wa2[lVar16 + -2] * pdVar42[iVar4])) *
             -0.9510565162951535) -
             (((wa3[lVar16 + -3] * pdVar39[iVar4] - local_b0[iVar4] * wa3[lVar16 + -2]) +
              (wa2[lVar16 + -3] * pdVar42[iVar4] - pdVar18[iVar4] * wa2[lVar16 + -2])) *
              0.30901699437494745 +
             ((wa4[lVar16 + -3] * pdVar15[iVar4] - pdVar21[iVar4] * wa4[lVar16 + -2]) +
             (wa1[lVar16 + -3] * pdVar24[iVar4] - pdVar12[iVar4] * wa1[lVar16 + -2])) *
             -0.8090169943749473 + local_180[iVar4]);
        iVar7 = iVar7 + iVar2 * -2;
        pdVar11 = pdVar11 + lVar22 * 2;
        pdVar12 = pdVar12 + lVar22 * 2;
        pdVar21 = pdVar21 + lVar22 * 2;
        pdVar18 = pdVar18 + lVar22 * 2;
        local_b0 = local_b0 + lVar22 * 2;
        local_168 = local_168 + lVar35 * 2;
        local_160 = local_160 + lVar35 * 2;
        local_158 = local_158 + lVar35 * 2;
        pdVar24 = pdVar24 + lVar22 * 2;
        pdVar15 = pdVar15 + lVar22 * 2;
        pdVar42 = pdVar42 + lVar22 * 2;
        pdVar39 = pdVar39 + lVar22 * 2;
        local_180 = local_180 + lVar22 * 2;
        local_150 = local_150 + lVar35 * 2;
        local_148 = local_148 + lVar35 * 2;
        local_140 = local_140 + lVar35 * 2;
      }
      iVar6 = iVar6 + iVar5;
      iVar25 = iVar25 + iVar5;
      iVar40 = iVar40 + iVar5;
      iVar33 = iVar33 + iVar5;
      local_d0 = local_d0 + lVar9;
      local_d8 = local_d8 + lVar9;
      pdVar20 = pdVar20 + lVar9;
      pdVar17 = pdVar17 + lVar9;
      pdVar43 = pdVar43 + lVar9;
      local_e0 = local_e0 + lVar30 * 5;
      local_e8 = local_e8 + lVar30 * 5;
      local_f0 = local_f0 + lVar30 * 5;
      pdVar23 = pdVar23 + lVar9;
      pdVar14 = pdVar14 + lVar9;
      pdVar27 = pdVar27 + lVar9;
      pdVar38 = pdVar38 + lVar9;
      pdVar10 = pdVar10 + lVar9;
      pdVar32 = pdVar32 + lVar30 * 5;
      local_f8 = local_f8 + lVar30 * 5;
      pdVar37 = pdVar37 + lVar30 * 5;
    }
  }
  return 0;
}

Assistant:

int r1f5kf_(int *ido, int *l1, fft_real_t *cc, int *
	in1, fft_real_t *ch, int *in2, fft_real_t *wa1, fft_real_t *wa2, fft_real_t *wa3, fft_real_t *
	wa4)
{
    /* System generated locals */
    int cc_dim1, cc_dim2, cc_dim3, cc_offset, ch_dim1, ch_dim2, ch_offset,
	     i__1, i__2;

    /* Builtin functions */

    /* Local variables */
     int i__, k, ic;
     fft_real_t arg, ti11, ti12, tr11, tr12;
     int idp2;


    /* Parameter adjustments */
    --wa4;
    --wa3;
    --wa2;
    --wa1;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *l1;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * 6);
    ch -= ch_offset;

    /* Function Body */
    arg = atan(1.0) * 8.0 / 5.0;
    tr11 = cos(arg);
    ti11 = sin(arg);
    tr12 = cos(arg * 2.0);
    ti12 = sin(arg * 2.0);
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ch[((k * 5 + 1) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		cc_dim2 + 1) * cc_dim1 + 1] + (cc[((k + cc_dim3 * 5) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + (cc[((k + (cc_dim3 << 2)) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) * cc_dim2
		+ 1) * cc_dim1 + 1]);
	ch[(*ido + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		 cc_dim2 + 1) * cc_dim1 + 1] + tr11 * (cc[((k + cc_dim3 * 5) *
		 cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + tr12 * (cc[((k + (cc_dim3 << 2)
		) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) *
		cc_dim2 + 1) * cc_dim1 + 1]);
	ch[((k * 5 + 3) * ch_dim2 + 1) * ch_dim1 + 1] = ti11 * (cc[((k +
		cc_dim3 * 5) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k + (
		cc_dim3 << 1)) * cc_dim2 + 1) * cc_dim1 + 1]) + ti12 * (cc[((
		k + (cc_dim3 << 2)) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k +
		cc_dim3 * 3) * cc_dim2 + 1) * cc_dim1 + 1]);
	ch[(*ido + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		 cc_dim2 + 1) * cc_dim1 + 1] + tr12 * (cc[((k + cc_dim3 * 5) *
		 cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + tr11 * (cc[((k + (cc_dim3 << 2)
		) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) *
		cc_dim2 + 1) * cc_dim1 + 1]);
	ch[((k * 5 + 5) * ch_dim2 + 1) * ch_dim1 + 1] = ti12 * (cc[((k +
		cc_dim3 * 5) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k + (
		cc_dim3 << 1)) * cc_dim2 + 1) * cc_dim1 + 1]) - ti11 * (cc[((
		k + (cc_dim3 << 2)) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k +
		cc_dim3 * 3) * cc_dim2 + 1) * cc_dim1 + 1]);
/* L101: */
    }
    if (*ido == 1) {
	return 0;
    }
    idp2 = *ido + 2;
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    ch[(i__ - 1 + (k * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + (wa1[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ - 1 + (
		    k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 1]
		    * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1]))
		    + (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		    cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + (wa1[i__ - 2] * cc[(
		    i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) * cc_dim2)
		     * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ - 1 + (k * 5 + 3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1]) + tr12 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		    3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1
		    + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]) + ti11 * (wa1[i__ - 2] * cc[(i__
		    + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] - wa1[
		    i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k + cc_dim3 *
		    5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] * cc[(i__ - 1
		    + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])) + ti12 * (
		    wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] * cc[(i__ +
		    (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - wa3[i__
		    - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1]));
	    ch[(ic - 1 + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1]) + tr12 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		    3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1
		    + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]) - (ti11 * (wa1[i__ - 2] * cc[(
		    i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + ti12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ + (k * 5 + 3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[i__ - 2]
		    * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		     - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])) + (ti11 * (wa4[i__ - 2] * cc[(
		    i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] +
		    wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 + (k + (
		    cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__ - 1] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]))
		     + ti12 * (wa3[i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (
		    k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - (wa2[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k + cc_dim3 * 3)
		    * cc_dim2) * cc_dim1 + 1])));
	    ch[(ic + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = ti11 * (wa4[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] + wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5)
		    * cc_dim2) * cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 +
		    (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__
		    - 1] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) *
		    cc_dim1 + 1])) + ti12 * (wa3[i__ - 2] * cc[(i__ - 1 + (k
		    + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1]
		     * cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] - (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1])) - (cc[(i__ + (k
		    + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[i__ -
		    2] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		     cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ - 1 + (k * 5 + 5) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1])) + tr11 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2]
		     * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1])) + (ti12 * (wa1[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		    - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) - ti11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(ic - 1 + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1])) + tr11 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2]
		     * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1])) - (ti12 * (wa1[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		    - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) - ti11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ + (k * 5 + 5) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[i__ - 2]
		    * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		     - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])) + (ti12 * (wa4[i__ - 2] * cc[(
		    i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] +
		    wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 + (k + (
		    cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__ - 1] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]))
		     - ti11 * (wa3[i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (
		    k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - (wa2[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k + cc_dim3 * 3)
		    * cc_dim2) * cc_dim1 + 1])));
	    ch[(ic + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = ti12 * (wa4[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] + wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5)
		    * cc_dim2) * cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 +
		    (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__
		    - 1] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) *
		    cc_dim1 + 1])) - ti11 * (wa3[i__ - 2] * cc[(i__ - 1 + (k
		    + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1]
		     * cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] - (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1])) - (cc[(i__ + (k
		    + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[i__ -
		    2] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		     cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
/* L102: */
	}
/* L103: */
    }
    return 0;
}